

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O1

bool __thiscall UniValue::pushKV(UniValue *this,string *key,UniValue *val_)

{
  VType VVar1;
  pointer pUVar2;
  bool bVar3;
  size_t in_RAX;
  size_t idx;
  size_t local_28;
  
  VVar1 = this->typ;
  if (VVar1 == VOBJ) {
    local_28 = in_RAX;
    bVar3 = findKey(this,key,&local_28);
    if (bVar3) {
      pUVar2 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      pUVar2[local_28].typ = val_->typ;
      std::__cxx11::string::_M_assign((string *)&pUVar2[local_28].val);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&pUVar2[local_28].keys,&val_->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::operator=
                (&pUVar2[local_28].values,&val_->values);
    }
    else {
      cfd::core::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&this->keys,(value_type *)key);
      std::vector<UniValue,_std::allocator<UniValue>_>::push_back(&this->values,val_);
    }
  }
  return VVar1 == VOBJ;
}

Assistant:

bool UniValue::pushKV(const std::string& key, const UniValue& val_)
{
    if (typ != VOBJ)
        return false;

    size_t idx;
    if (findKey(key, idx))
        values[idx] = val_;
    else
        __pushKV(key, val_);
    return true;
}